

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O3

bool TTD::NSSnapValues::CheckSnapEquivTTDDouble(double d1,double d2)

{
  bool bVar1;
  
  bVar1 = Js::NumberUtilities::IsNan(d1);
  if ((!bVar1) && (bVar1 = Js::NumberUtilities::IsNan(d2), !bVar1)) {
    return (bool)(-(d1 == d2) & 1);
  }
  bVar1 = Js::NumberUtilities::IsNan(d1);
  if (!bVar1) {
    return false;
  }
  bVar1 = Js::NumberUtilities::IsNan(d2);
  return bVar1;
}

Assistant:

bool CheckSnapEquivTTDDouble(double d1, double d2)
        {
            if(Js::JavascriptNumber::IsNan(d1) || Js::JavascriptNumber::IsNan(d2))
            {
                return (Js::JavascriptNumber::IsNan(d1) && Js::JavascriptNumber::IsNan(d2));
            }
            else
            {
                return (d1 == d2);
            }
        }